

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freeze_spec_constant_value_pass.cpp
# Opt level: O1

Status __thiscall
spvtools::opt::FreezeSpecConstantValuePass::Process(FreezeSpecConstantValuePass *this)

{
  bool modified;
  byte local_29;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_28._M_unused._M_object = &local_29;
  local_29 = 0;
  local_28._8_8_ = (this->super_Pass).context_;
  pcStack_10 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/freeze_spec_constant_value_pass.cpp:24:30)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/freeze_spec_constant_value_pass.cpp:24:30)>
             ::_M_manager;
  Module::ForEachInst((((IRContext *)local_28._8_8_)->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                      (function<void_(spvtools::opt::Instruction_*)> *)&local_28,false);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return local_29 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status FreezeSpecConstantValuePass::Process() {
  bool modified = false;
  auto ctx = context();
  ctx->module()->ForEachInst([&modified, ctx](Instruction* inst) {
    switch (inst->opcode()) {
      case spv::Op::OpSpecConstant:
        inst->SetOpcode(spv::Op::OpConstant);
        modified = true;
        break;
      case spv::Op::OpSpecConstantTrue:
        inst->SetOpcode(spv::Op::OpConstantTrue);
        modified = true;
        break;
      case spv::Op::OpSpecConstantFalse:
        inst->SetOpcode(spv::Op::OpConstantFalse);
        modified = true;
        break;
      case spv::Op::OpDecorate:
        if (spv::Decoration(inst->GetSingleWordInOperand(1)) ==
            spv::Decoration::SpecId) {
          ctx->KillInst(inst);
          modified = true;
        }
        break;
      default:
        break;
    }
  });
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}